

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

void set_error(archive_read *a,int ret)

{
  char *fmt;
  int iStack_8;
  
  switch(ret) {
  case 0:
  case 1:
    return;
  default:
    fmt = "Lzma decompression failed:  Unknown error";
    break;
  case 5:
    fmt = "Lzma library error: Cannot allocate memory";
    goto LAB_0045209b;
  case 6:
    fmt = "Lzma library error: Out of memory";
LAB_0045209b:
    iStack_8 = 0xc;
    goto LAB_004520a8;
  case 7:
    fmt = "Lzma library error: format not recognized";
    break;
  case 8:
    fmt = "Lzma library error: Invalid options";
    break;
  case 9:
    fmt = "Lzma library error: Corrupted input data";
    break;
  case 10:
    fmt = "Lzma library error:  No progress is possible";
  }
  iStack_8 = -1;
LAB_004520a8:
  archive_set_error(&a->archive,iStack_8,fmt);
  return;
}

Assistant:

static void
set_error(struct archive_read *a, int ret)
{

	switch (ret) {
	case LZMA_STREAM_END: /* Found end of stream. */
	case LZMA_OK: /* Decompressor made some progress. */
		break;
	case LZMA_MEM_ERROR:
		archive_set_error(&a->archive, ENOMEM,
		    "Lzma library error: Cannot allocate memory");
		break;
	case LZMA_MEMLIMIT_ERROR:
		archive_set_error(&a->archive, ENOMEM,
		    "Lzma library error: Out of memory");
		break;
	case LZMA_FORMAT_ERROR:
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Lzma library error: format not recognized");
		break;
	case LZMA_OPTIONS_ERROR:
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Lzma library error: Invalid options");
		break;
	case LZMA_DATA_ERROR:
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Lzma library error: Corrupted input data");
		break;
	case LZMA_BUF_ERROR:
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Lzma library error:  No progress is possible");
		break;
	default:
		/* Return an error. */
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Lzma decompression failed:  Unknown error");
		break;
	}
}